

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O1

void string_suite::test_escape_reverse_solidus(void)

{
  string value;
  char input [5];
  iarchive in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  char local_188 [8];
  undefined **local_180 [43];
  pointer local_28;
  pointer local_18;
  
  builtin_strncpy(local_188,"\"\\\\\"",5);
  local_1a8._M_dataplus._M_p = (pointer)strlen(local_188);
  local_1a8._M_string_length = (size_type)local_188;
  trial::protocol::json::basic_iarchive<char>::basic_iarchive
            ((basic_iarchive<char> *)local_180,(view_type *)&local_1a8);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"EMPTY","");
  trial::protocol::json::basic_iarchive<char>::load<std::__cxx11::string>
            ((basic_iarchive<char> *)local_180,&local_1a8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("value","\"\\\\\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0xef,"void string_suite::test_escape_reverse_solidus()",&local_1a8,"\\");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_180[0] = &PTR_vload_001385c8;
  if (local_28 != (pointer)0x0) {
    operator_delete(local_28,(long)local_18 - (long)local_28);
  }
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)local_180);
  return;
}

Assistant:

void test_escape_reverse_solidus()
{
    const char input[] = "\"\\\\\"";
    json::iarchive in(input);
    std::string value("EMPTY");
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value, "\\");
}